

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

string * __thiscall
t_lua_generator::argument_list
          (string *__return_storage_ptr__,t_lua_generator *this,t_struct *tstruct,string *prefix)

{
  bool bVar1;
  reference pptVar2;
  string *__rhs;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_60;
  t_field **local_58;
  allocator local_3a;
  undefined1 local_39;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_38;
  const_iterator fld_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string *prefix_local;
  t_struct *tstruct_local;
  t_lua_generator *this_local;
  string *ret;
  
  fld_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_38);
  local_39 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  local_58 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(fld_iter._M_current);
  local_38._M_current = local_58;
  while( true ) {
    local_60._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(fld_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_60);
    if (!bVar1) break;
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    __rhs = t_field::get_name_abi_cxx11_(*pptVar2);
    std::operator+(&local_80,prefix,__rhs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_38);
    local_88._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(fld_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_88);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_lua_generator::argument_list(t_struct* tstruct, string prefix) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator fld_iter;
  std::string ret = "";
  for (fld_iter = fields.begin(); fld_iter != fields.end();) {
    ret += prefix + (*fld_iter)->get_name();
    ++fld_iter;
    if (fld_iter != fields.end()) {
      ret += ", ";
    }
  }
  return ret;
}